

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::replace(String *this,size_t pos1,size_t n1,char *s,size_t n2)

{
  StringBaseType *__s;
  undefined1 local_50 [8];
  String tmp;
  size_t n2_local;
  char *s_local;
  size_t n1_local;
  size_t pos1_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = n2;
  String((String *)local_50,s);
  __s = data((String *)local_50);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,pos1,n1,__s,tmp.mString.field_2._8_8_);
  ~String((String *)local_50);
  return this;
}

Assistant:

String& String::replace( size_t pos1, size_t n1, const char* s, size_t n2 ) {
	String tmp( s );

	mString.replace( pos1, n1, tmp.data(), n2 );

	return *this;
}